

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

ContainerMetadata __thiscall
duckdb::roaring::ContainerMetadataCollectionScanner::GetNext
          (ContainerMetadataCollectionScanner *this)

{
  byte bVar1;
  size_type sVar2;
  ContainerMetadataCollection *pCVar3;
  ContainerMetadata CVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  sVar2 = this->idx;
  this->idx = sVar2 + 1;
  pbVar5 = vector<unsigned_char,_true>::operator[](&this->collection->container_type,sVar2);
  bVar1 = *pbVar5;
  uVar8 = (ulong)(bVar1 & 2);
  lVar7 = 0x18;
  if ((bVar1 & 2) == 0) {
    lVar7 = 0x30;
  }
  pCVar3 = this->collection;
  sVar2 = *(size_type *)((long)&this->array_idx + uVar8 * 4);
  *(size_type *)((long)&this->array_idx + uVar8 * 4) = sVar2 + 1;
  pbVar5 = vector<unsigned_char,_true>::operator[]
                     ((vector<unsigned_char,_true> *)
                      ((long)&(pCVar3->container_type).
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar7),sVar2);
  uVar6 = (uint)*pbVar5;
  if ((bVar1 & 2) == 0) {
    CVar4.container_type = BITSET_CONTAINER;
    CVar4.nulls = true;
    CVar4.count = 0xf9;
    if (uVar6 != 0xf9) {
      CVar4 = (ContainerMetadata)(uVar6 * 0x10000 + (bVar1 & 1) * 0x100 + 1);
    }
  }
  else {
    CVar4 = (ContainerMetadata)(uVar6 << 0x10 | 0x100);
  }
  return CVar4;
}

Assistant:

ContainerMetadata ContainerMetadataCollectionScanner::GetNext() {
	D_ASSERT(idx < collection.count_in_segment);
	auto type = collection.container_type[idx++];
	const bool is_inverted = (type & 1) == 1;
	const bool is_run = ((type >> 1) & 1) == 1;
	uint8_t amount;
	if (is_run) {
		amount = collection.number_of_runs[run_idx++];
	} else {
		amount = collection.cardinality[array_idx++];
	}
	if (is_run) {
		return ContainerMetadata::RunContainer(amount);
	}
	if (amount == BITSET_CONTAINER_SENTINEL_VALUE) {
		return ContainerMetadata::BitsetContainer(amount);
	}
	return ContainerMetadata::ArrayContainer(amount, is_inverted);
}